

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5047c::DFDVkFormatListTest_BidirectionalVk2DfDTest_Test::
~DFDVkFormatListTest_BidirectionalVk2DfDTest_Test
          (DFDVkFormatListTest_BidirectionalVk2DfDTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DFDVkFormatListTest, BidirectionalVk2DfDTest) {

    for (uint32_t i = 0; i < sizeof(formats) / sizeof(VkFormat); i++) {
        uint32_t* dfd = vk2dfd(formats[i]);
        ASSERT_TRUE(dfd != NULL) << "vk2dfd failed to produce DFD for "
                                 << vkFormatString(formats[i]);
        VkFormat formatOut = dfd2vk(dfd);
        // The SCALED formats are indistinguishable from the INT formats
        // and dfd2vk resolves the ambiguity in favor of the format more
        // likely to be used as a texture.
        //
        // The A8B8G8R8_*_PACK32 formats are indistinguishable from the
        // R8G8B8A8* formats and dfd2vk returns the more common format.
        switch (formats[i]) {
          case VK_FORMAT_R8_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8_UINT);
            break;
          case VK_FORMAT_R8_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8_SINT);
            break;
          case VK_FORMAT_R8G8_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8_UINT);
            break;
          case VK_FORMAT_R8G8_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8_SINT);
            break;
          case VK_FORMAT_B8G8R8_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_B8G8R8_UINT);
            break;
          case VK_FORMAT_B8G8R8_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_B8G8R8_SINT);
            break;
          case VK_FORMAT_R8G8B8_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8_UINT);
            break;
          case VK_FORMAT_R8G8B8_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8_SINT);
            break;
          case VK_FORMAT_R8G8B8A8_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_UINT);
            break;
          case VK_FORMAT_R8G8B8A8_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_SINT);
            break;
          case VK_FORMAT_B8G8R8A8_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_B8G8R8A8_UINT);
            break;
          case VK_FORMAT_B8G8R8A8_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_B8G8R8A8_SINT);
            break;
          case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_UINT);
            break;
          case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_SINT);
            break;
          case VK_FORMAT_A8B8G8R8_UINT_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_UINT);
            break;
          case VK_FORMAT_A8B8G8R8_SINT_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_SINT);
            break;
          case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_SRGB);
            break;
          case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_A2R10G10B10_UINT_PACK32);
            break;
          case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_A2R10G10B10_SINT_PACK32);
            break;
          case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_A2B10G10R10_UINT_PACK32);
            break;
          case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_A2B10G10R10_SINT_PACK32);
            break;
          case VK_FORMAT_R16_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16_UINT);
            break;
          case VK_FORMAT_R16_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16_SINT);
            break;
          case VK_FORMAT_R16G16_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16G16_UINT);
            break;
          case VK_FORMAT_R16G16_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16G16_SINT);
            break;
          case VK_FORMAT_R16G16B16_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16G16B16_UINT);
            break;
          case VK_FORMAT_R16G16B16_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16G16B16_SINT);
            break;
          case VK_FORMAT_R16G16B16A16_USCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16G16B16A16_UINT);
            break;
          case VK_FORMAT_R16G16B16A16_SSCALED:
            EXPECT_EQ(formatOut, VK_FORMAT_R16G16B16A16_SINT);
            break;
          case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_UNORM);
            break;
          case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
            EXPECT_EQ(formatOut, VK_FORMAT_R8G8B8A8_SNORM);
            break;
          default:
            EXPECT_EQ(formatOut, formats[i]);
        }
        free(dfd);
    }
}